

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha1.c
# Opt level: O3

void pp_crypto_hash_sha1_process(PHashSHA1 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  puint32 pVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  
  if (ctx != (PHashSHA1 *)0x0) {
    uVar1 = ctx->hash[0];
    uVar2 = ctx->hash[1];
    uVar3 = ctx->hash[2];
    uVar4 = ctx->hash[3];
    pVar5 = ctx->hash[4];
    uVar12 = (uVar1 << 5 | uVar1 >> 0x1b) + *data + pVar5 + ((uVar3 ^ uVar4) & uVar2 ^ uVar4) +
             0x5a827999;
    uVar8 = uVar2 << 0x1e | uVar2 >> 2;
    uVar17 = uVar1 << 0x1e | uVar1 >> 2;
    uVar23 = ((uVar8 ^ uVar3) & uVar1 ^ uVar3) + data[1] + uVar4 + 0x5a827999 +
             (uVar12 * 0x20 | uVar12 >> 0x1b);
    uVar6 = data[2];
    uVar7 = ((uVar17 ^ uVar8) & uVar12 ^ uVar8) + uVar6 + uVar3 + 0x5a827999 +
            (uVar23 * 0x20 | uVar23 >> 0x1b);
    uVar13 = uVar12 * 0x40000000 | uVar12 >> 2;
    uVar12 = data[3];
    uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
    uVar23 = uVar8 + uVar12 + ((uVar13 ^ uVar17) & uVar23 ^ uVar17) + 0x5a827999 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar8 = data[4];
    uVar18 = uVar17 + uVar8 + ((uVar24 ^ uVar13) & uVar7 ^ uVar13) + 0x5a827999 +
             (uVar23 * 0x20 | uVar23 >> 0x1b);
    uVar17 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar7 = data[5];
    uVar9 = uVar23 * 0x40000000 | uVar23 >> 2;
    uVar14 = uVar13 + uVar7 + ((uVar17 ^ uVar24) & uVar23 ^ uVar24) + 0x5a827999 +
             (uVar18 * 0x20 | uVar18 >> 0x1b);
    uVar23 = data[6];
    uVar25 = uVar24 + uVar23 + ((uVar9 ^ uVar17) & uVar18 ^ uVar17) + 0x5a827999 +
             (uVar14 * 0x20 | uVar14 >> 0x1b);
    uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
    uVar13 = data[7];
    uVar24 = uVar14 * 0x40000000 | uVar14 >> 2;
    uVar14 = uVar17 + uVar13 + ((uVar19 ^ uVar9) & uVar14 ^ uVar9) + 0x5a827999 +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar17 = data[8];
    uVar18 = uVar9 + uVar17 + ((uVar24 ^ uVar19) & uVar25 ^ uVar19) + 0x5a827999 +
             (uVar14 * 0x20 | uVar14 >> 0x1b);
    uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar9 = data[9];
    uVar25 = uVar14 * 0x40000000 | uVar14 >> 2;
    uVar20 = uVar19 + uVar9 + ((uVar26 ^ uVar24) & uVar14 ^ uVar24) + 0x5a827999 +
             (uVar18 * 0x20 | uVar18 >> 0x1b);
    uVar14 = data[10];
    uVar15 = uVar24 + uVar14 + ((uVar25 ^ uVar26) & uVar18 ^ uVar26) + 0x5a827999 +
             (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar19 = uVar18 * 0x40000000 | uVar18 >> 2;
    uVar18 = data[0xb];
    uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar26 = uVar26 + uVar18 + ((uVar19 ^ uVar25) & uVar20 ^ uVar25) + 0x5a827999 +
             (uVar15 * 0x20 | uVar15 >> 0x1b);
    uVar24 = data[0xc];
    uVar20 = uVar25 + uVar24 + ((uVar21 ^ uVar19) & uVar15 ^ uVar19) + 0x5a827999 +
             (uVar26 * 0x20 | uVar26 >> 0x1b);
    uVar16 = uVar15 * 0x40000000 | uVar15 >> 2;
    uVar25 = data[0xd];
    uVar27 = uVar26 * 0x40000000 | uVar26 >> 2;
    uVar26 = uVar19 + uVar25 + ((uVar16 ^ uVar21) & uVar26 ^ uVar21) + 0x5a827999 +
             (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar19 = data[0xe];
    uVar22 = uVar21 + uVar19 + ((uVar27 ^ uVar16) & uVar20 ^ uVar16) + 0x5a827999 +
             (uVar26 * 0x20 | uVar26 >> 0x1b);
    uVar15 = data[0xf];
    uVar21 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar10 = uVar26 * 0x40000000 | uVar26 >> 2;
    uVar26 = uVar16 + uVar15 + ((uVar21 ^ uVar27) & uVar26 ^ uVar27) + 0x5a827999 +
             (uVar22 * 0x20 | uVar22 >> 0x1b);
    uVar20 = uVar17 ^ uVar25 ^ *data ^ uVar6;
    uVar20 = uVar20 << 1 | (uint)((int)uVar20 < 0);
    uVar28 = uVar27 + uVar20 + ((uVar10 ^ uVar21) & uVar22 ^ uVar21) + 0x5a827999 +
             (uVar26 * 0x20 | uVar26 >> 0x1b);
    uVar16 = uVar9 ^ uVar19 ^ data[1] ^ uVar12;
    uVar27 = uVar22 * 0x40000000 | uVar22 >> 2;
    uVar32 = uVar16 << 1 | (uint)((int)uVar16 < 0);
    uVar21 = uVar21 + uVar32 + ((uVar27 ^ uVar10) & uVar26 ^ uVar10) + 0x5a827999 +
             (uVar28 * 0x20 | uVar28 >> 0x1b);
    uVar6 = uVar14 ^ uVar15 ^ uVar6 ^ uVar8;
    uVar22 = uVar26 * 0x40000000 | uVar26 >> 2;
    uVar26 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar16 = uVar10 + uVar26 + ((uVar22 ^ uVar27) & uVar28 ^ uVar27) + 0x5a827999 +
             (uVar21 * 0x20 | uVar21 >> 0x1b);
    uVar28 = uVar28 * 0x40000000 | uVar28 >> 2;
    uVar6 = uVar12 ^ uVar7 ^ uVar18 ^ uVar20;
    uVar31 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar12 = uVar27 + uVar31 + ((uVar28 ^ uVar22) & uVar21 ^ uVar22) + 0x5a827999 +
             (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar10 = uVar21 * 0x40000000 | uVar21 >> 2;
    uVar6 = uVar8 ^ uVar23 ^ uVar24 ^ uVar32;
    uVar21 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar22 = uVar22 + uVar21 + (uVar10 ^ uVar28 ^ uVar16) + 0x6ed9eba1 +
             (uVar12 * 0x20 | uVar12 >> 0x1b);
    uVar8 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar6 = uVar7 ^ uVar13 ^ uVar25 ^ uVar26;
    uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar28 = uVar28 + uVar6 + (uVar8 ^ uVar10 ^ uVar12) + 0x6ed9eba1 +
             (uVar22 * 0x20 | uVar22 >> 0x1b);
    uVar27 = uVar12 * 0x40000000 | uVar12 >> 2;
    uVar12 = uVar23 ^ uVar17 ^ uVar19 ^ uVar31;
    uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar7 = uVar10 + uVar12 + (uVar27 ^ uVar8 ^ uVar22) + 0x6ed9eba1 +
            (uVar28 * 0x20 | uVar28 >> 0x1b);
    uVar16 = uVar22 * 0x40000000 | uVar22 >> 2;
    uVar23 = uVar13 ^ uVar9 ^ uVar15 ^ uVar21;
    uVar30 = uVar23 << 1 | (uint)((int)uVar23 < 0);
    uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
    uVar10 = uVar8 + uVar30 + (uVar16 ^ uVar27 ^ uVar28) + 0x6ed9eba1 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar8 = uVar17 ^ uVar14 ^ uVar20 ^ uVar6;
    uVar23 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar22 = uVar27 + uVar23 + (uVar29 ^ uVar16 ^ uVar7) + 0x6ed9eba1 +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar13 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar8 = uVar9 ^ uVar18 ^ uVar32 ^ uVar12;
    uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar17 = uVar16 + uVar8 + (uVar13 ^ uVar29 ^ uVar10) + 0x6ed9eba1 +
             (uVar22 * 0x20 | uVar22 >> 0x1b);
    uVar9 = uVar10 * 0x40000000 | uVar10 >> 2;
    uVar7 = uVar14 ^ uVar24 ^ uVar26 ^ uVar30;
    uVar10 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar27 = uVar29 + uVar10 + (uVar9 ^ uVar13 ^ uVar22) + 0x6ed9eba1 +
             (uVar17 * 0x20 | uVar17 >> 0x1b);
    uVar22 = uVar22 * 0x40000000 | uVar22 >> 2;
    uVar7 = uVar18 ^ uVar25 ^ uVar31 ^ uVar23;
    uVar16 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
    uVar17 = uVar13 + uVar16 + (uVar22 ^ uVar9 ^ uVar17) + 0x6ed9eba1 +
             (uVar27 * 0x20 | uVar27 >> 0x1b);
    uVar7 = uVar24 ^ uVar19 ^ uVar21 ^ uVar8;
    uVar13 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar14 = uVar9 + uVar13 + (uVar18 ^ uVar22 ^ uVar27) + 0x6ed9eba1 +
             (uVar17 * 0x20 | uVar17 >> 0x1b);
    uVar27 = uVar27 * 0x40000000 | uVar27 >> 2;
    uVar7 = uVar25 ^ uVar15 ^ uVar6 ^ uVar10;
    uVar28 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar25 = uVar22 + uVar28 + (uVar27 ^ uVar18 ^ uVar17) + 0x6ed9eba1 +
             (uVar14 * 0x20 | uVar14 >> 0x1b);
    uVar9 = uVar17 * 0x40000000 | uVar17 >> 2;
    uVar7 = uVar19 ^ uVar20 ^ uVar12 ^ uVar16;
    uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar24 = uVar18 + uVar7 + (uVar9 ^ uVar27 ^ uVar14) + 0x6ed9eba1 +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar18 = uVar14 * 0x40000000 | uVar14 >> 2;
    uVar17 = uVar15 ^ uVar32 ^ uVar30 ^ uVar13;
    uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
    uVar22 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar25 = uVar27 + uVar17 + (uVar18 ^ uVar9 ^ uVar25) + 0x6ed9eba1 +
             (uVar24 * 0x20 | uVar24 >> 0x1b);
    uVar14 = uVar20 ^ uVar26 ^ uVar23 ^ uVar28;
    uVar15 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    uVar14 = uVar9 + uVar15 + (uVar22 ^ uVar18 ^ uVar24) + 0x6ed9eba1 +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar19 = uVar24 * 0x40000000 | uVar24 >> 2;
    uVar9 = uVar32 ^ uVar31 ^ uVar8 ^ uVar7;
    uVar32 = uVar9 << 1 | (uint)((int)uVar9 < 0);
    uVar24 = uVar18 + uVar32 + (uVar19 ^ uVar22 ^ uVar25) + 0x6ed9eba1 +
             (uVar14 * 0x20 | uVar14 >> 0x1b);
    uVar27 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar9 = uVar26 ^ uVar21 ^ uVar10 ^ uVar17;
    uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
    uVar20 = uVar22 + uVar9 + (uVar27 ^ uVar19 ^ uVar14) + 0x6ed9eba1 +
             (uVar24 * 0x20 | uVar24 >> 0x1b);
    uVar18 = uVar14 * 0x40000000 | uVar14 >> 2;
    uVar14 = uVar31 ^ uVar6 ^ uVar16 ^ uVar15;
    uVar29 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
    uVar19 = uVar19 + uVar29 + (uVar18 ^ uVar27 ^ uVar24) + 0x6ed9eba1 +
             (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar14 = uVar21 ^ uVar12 ^ uVar13 ^ uVar32;
    uVar24 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    uVar14 = uVar27 + uVar24 + (uVar25 ^ uVar18 ^ uVar20) + 0x6ed9eba1 +
             (uVar19 * 0x20 | uVar19 >> 0x1b);
    uVar26 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar6 = uVar6 ^ uVar30 ^ uVar28 ^ uVar9;
    uVar21 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar18 = uVar18 + uVar21 + (uVar26 ^ uVar25 ^ uVar19) + 0x6ed9eba1 +
             (uVar14 * 0x20 | uVar14 >> 0x1b);
    uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
    uVar6 = uVar12 ^ uVar23 ^ uVar7 ^ uVar29;
    uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar19 = uVar25 + uVar6 + (uVar20 ^ uVar26 ^ uVar14) + 0x6ed9eba1 +
             (uVar18 * 0x20 | uVar18 >> 0x1b);
    uVar22 = uVar14 * 0x40000000 | uVar14 >> 2;
    uVar12 = uVar30 ^ uVar8 ^ uVar17 ^ uVar24;
    uVar14 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar25 = uVar18 * 0x40000000 | uVar18 >> 2;
    uVar18 = uVar26 + uVar14 + (uVar22 ^ uVar20 ^ uVar18) + 0x6ed9eba1 +
             (uVar19 * 0x20 | uVar19 >> 0x1b);
    uVar12 = uVar23 ^ uVar10 ^ uVar15 ^ uVar21;
    uVar30 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar20 = uVar20 + uVar30 + (uVar25 & uVar22 | (uVar25 | uVar22) & uVar19) + -0x70e44324 +
             (uVar18 * 0x20 | uVar18 >> 0x1b);
    uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
    uVar12 = uVar8 ^ uVar16 ^ uVar32 ^ uVar6;
    uVar26 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar8 = uVar22 + uVar26 + (uVar19 & uVar25 | (uVar19 | uVar25) & uVar18) + -0x70e44324 +
            (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar22 = uVar18 * 0x40000000 | uVar18 >> 2;
    uVar12 = uVar10 ^ uVar13 ^ uVar9 ^ uVar14;
    uVar18 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar23 = uVar25 + uVar18 + (uVar22 & uVar19 | (uVar22 | uVar19) & uVar20) + -0x70e44324 +
             (uVar8 * 0x20 | uVar8 >> 0x1b);
    uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar12 = uVar16 ^ uVar28 ^ uVar29 ^ uVar30;
    uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar25 = uVar19 + uVar12 + (uVar20 & uVar22 | (uVar20 | uVar22) & uVar8) + -0x70e44324 +
             (uVar23 * 0x20 | uVar23 >> 0x1b);
    uVar10 = uVar8 * 0x40000000 | uVar8 >> 2;
    uVar8 = uVar13 ^ uVar7 ^ uVar24 ^ uVar26;
    uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar13 = uVar22 + uVar8 + (uVar10 & uVar20 | (uVar10 | uVar20) & uVar23) + -0x70e44324 +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
    uVar19 = uVar28 ^ uVar17 ^ uVar21 ^ uVar18;
    uVar27 = uVar19 << 1 | (uint)((int)uVar19 < 0);
    uVar20 = uVar20 + uVar27 + (uVar23 & uVar10 | (uVar23 | uVar10) & uVar25) + -0x70e44324 +
             (uVar13 * 0x20 | uVar13 >> 0x1b);
    uVar19 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar7 = uVar7 ^ uVar15 ^ uVar6 ^ uVar12;
    uVar25 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar16 = uVar10 + uVar25 + (uVar19 & uVar23 | (uVar19 | uVar23) & uVar13) + -0x70e44324 +
             (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar10 = uVar13 * 0x40000000 | uVar13 >> 2;
    uVar7 = uVar17 ^ uVar32 ^ uVar14 ^ uVar8;
    uVar13 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar7 = uVar23 + uVar13 + (uVar10 & uVar19 | (uVar10 | uVar19) & uVar20) + -0x70e44324 +
            (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar23 = uVar15 ^ uVar9 ^ uVar30 ^ uVar27;
    uVar15 = uVar23 << 1 | (uint)((int)uVar23 < 0);
    uVar17 = uVar19 + uVar15 + (uVar20 & uVar10 | (uVar20 | uVar10) & uVar16) + -0x70e44324 +
             (uVar7 * 0x20 | uVar7 >> 0x1b);
    uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar23 = uVar32 ^ uVar29 ^ uVar26 ^ uVar25;
    uVar32 = uVar23 << 1 | (uint)((int)uVar23 < 0);
    uVar10 = uVar10 + uVar32 + (uVar16 & uVar20 | (uVar16 | uVar20) & uVar7) + -0x70e44324 +
             (uVar17 * 0x20 | uVar17 >> 0x1b);
    uVar23 = uVar7 * 0x40000000 | uVar7 >> 2;
    uVar7 = uVar9 ^ uVar24 ^ uVar18 ^ uVar13;
    uVar31 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar19 = uVar20 + uVar31 + (uVar23 & uVar16 | (uVar23 | uVar16) & uVar17) + -0x70e44324 +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar9 = uVar17 * 0x40000000 | uVar17 >> 2;
    uVar7 = uVar29 ^ uVar21 ^ uVar12 ^ uVar15;
    uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar16 = uVar16 + uVar7 + (uVar9 & uVar23 | (uVar9 | uVar23) & uVar10) + -0x70e44324 +
             (uVar19 * 0x20 | uVar19 >> 0x1b);
    uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
    uVar17 = uVar24 ^ uVar6 ^ uVar8 ^ uVar32;
    uVar20 = uVar17 << 1 | (uint)((int)uVar17 < 0);
    uVar17 = uVar23 + uVar20 + (uVar10 & uVar9 | (uVar10 | uVar9) & uVar19) + -0x70e44324 +
             (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
    uVar23 = uVar21 ^ uVar14 ^ uVar27 ^ uVar31;
    uVar23 = uVar23 << 1 | (uint)((int)uVar23 < 0);
    uVar9 = uVar9 + uVar23 + (uVar19 & uVar10 | (uVar19 | uVar10) & uVar16) + -0x70e44324 +
            (uVar17 * 0x20 | uVar17 >> 0x1b);
    uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar6 = uVar6 ^ uVar30 ^ uVar25 ^ uVar7;
    uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar10 = uVar10 + uVar6 + (uVar16 & uVar19 | (uVar16 | uVar19) & uVar17) + -0x70e44324 +
             (uVar9 * 0x20 | uVar9 >> 0x1b);
    uVar24 = uVar17 * 0x40000000 | uVar17 >> 2;
    uVar17 = uVar14 ^ uVar26 ^ uVar13 ^ uVar20;
    uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
    uVar21 = uVar19 + uVar17 + (uVar24 & uVar16 | (uVar24 | uVar16) & uVar9) + -0x70e44324 +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar19 = uVar9 * 0x40000000 | uVar9 >> 2;
    uVar9 = uVar30 ^ uVar18 ^ uVar15 ^ uVar23;
    uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
    uVar16 = uVar16 + uVar9 + (uVar19 & uVar24 | (uVar19 | uVar24) & uVar10) + -0x70e44324 +
             (uVar21 * 0x20 | uVar21 >> 0x1b);
    uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
    uVar14 = uVar26 ^ uVar12 ^ uVar32 ^ uVar6;
    uVar26 = uVar14 << 1 | (uint)((int)uVar14 < 0);
    uVar14 = uVar24 + uVar26 + (uVar10 & uVar19 | (uVar10 | uVar19) & uVar21) + -0x70e44324 +
             (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
    uVar18 = uVar18 ^ uVar8 ^ uVar31 ^ uVar17;
    uVar29 = uVar18 << 1 | (uint)((int)uVar18 < 0);
    uVar19 = uVar19 + uVar29 + (uVar21 & uVar10 | (uVar21 | uVar10) & uVar16) + -0x70e44324 +
             (uVar14 * 0x20 | uVar14 >> 0x1b);
    uVar22 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar12 = uVar12 ^ uVar27 ^ uVar7 ^ uVar9;
    uVar18 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar10 = uVar10 + uVar18 + (uVar22 & uVar21 | (uVar22 | uVar21) & uVar14) + -0x70e44324 +
             (uVar19 * 0x20 | uVar19 >> 0x1b);
    uVar24 = uVar14 * 0x40000000 | uVar14 >> 2;
    uVar12 = uVar8 ^ uVar25 ^ uVar20 ^ uVar26;
    uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
    uVar21 = uVar21 + uVar12 + (uVar24 ^ uVar22 ^ uVar19) + -0x359d3e2a +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
    uVar8 = uVar27 ^ uVar13 ^ uVar23 ^ uVar29;
    uVar28 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar16 = uVar10 * 0x40000000 | uVar10 >> 2;
    uVar10 = uVar22 + uVar28 + (uVar19 ^ uVar24 ^ uVar10) + -0x359d3e2a +
             (uVar21 * 0x20 | uVar21 >> 0x1b);
    uVar8 = uVar25 ^ uVar15 ^ uVar6 ^ uVar18;
    uVar14 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar24 = uVar24 + uVar14 + (uVar16 ^ uVar19 ^ uVar21) + -0x359d3e2a +
             (uVar10 * 0x20 | uVar10 >> 0x1b);
    uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
    uVar8 = uVar13 ^ uVar32 ^ uVar17 ^ uVar12;
    uVar13 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar25 = uVar19 + uVar13 + (uVar21 ^ uVar16 ^ uVar10) + -0x359d3e2a +
             (uVar24 * 0x20 | uVar24 >> 0x1b);
    uVar22 = uVar10 * 0x40000000 | uVar10 >> 2;
    uVar8 = uVar15 ^ uVar31 ^ uVar9 ^ uVar28;
    uVar15 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar16 = uVar16 + uVar15 + (uVar22 ^ uVar21 ^ uVar24) + -0x359d3e2a +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar8 = uVar24 * 0x40000000 | uVar24 >> 2;
    uVar24 = uVar32 ^ uVar7 ^ uVar26 ^ uVar14;
    uVar30 = uVar24 << 1 | (uint)((int)uVar24 < 0);
    uVar19 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar25 = uVar21 + uVar30 + (uVar8 ^ uVar22 ^ uVar25) + -0x359d3e2a +
             (uVar16 * 0x20 | uVar16 >> 0x1b);
    uVar24 = uVar31 ^ uVar20 ^ uVar29 ^ uVar13;
    uVar10 = uVar24 << 1 | (uint)((int)uVar24 < 0);
    uVar27 = uVar22 + uVar10 + (uVar19 ^ uVar8 ^ uVar16) + -0x359d3e2a +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar22 = uVar16 * 0x40000000 | uVar16 >> 2;
    uVar7 = uVar7 ^ uVar23 ^ uVar18 ^ uVar15;
    uVar16 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar24 = uVar8 + uVar16 + (uVar22 ^ uVar19 ^ uVar25) + -0x359d3e2a +
             (uVar27 * 0x20 | uVar27 >> 0x1b);
    uVar21 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar8 = uVar20 ^ uVar6 ^ uVar12 ^ uVar30;
    uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
    uVar25 = uVar19 + uVar8 + (uVar21 ^ uVar22 ^ uVar27) + -0x359d3e2a +
             (uVar24 * 0x20 | uVar24 >> 0x1b);
    uVar27 = uVar27 * 0x40000000 | uVar27 >> 2;
    uVar7 = uVar23 ^ uVar17 ^ uVar28 ^ uVar10;
    uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
    uVar23 = uVar24 * 0x40000000 | uVar24 >> 2;
    uVar20 = uVar22 + uVar7 + (uVar27 ^ uVar21 ^ uVar24) + -0x359d3e2a +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar6 = uVar6 ^ uVar9 ^ uVar14 ^ uVar16;
    uVar24 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar19 = uVar21 + uVar24 + (uVar23 ^ uVar27 ^ uVar25) + -0x359d3e2a +
             (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar6 = uVar17 ^ uVar26 ^ uVar13 ^ uVar8;
    uVar22 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar17 = uVar27 + uVar22 + (uVar25 ^ uVar23 ^ uVar20) + -0x359d3e2a +
             (uVar19 * 0x20 | uVar19 >> 0x1b);
    uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar6 = uVar9 ^ uVar29 ^ uVar15 ^ uVar7;
    uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar9 = uVar23 + uVar6 + (uVar20 ^ uVar25 ^ uVar19) + -0x359d3e2a +
            (uVar17 * 0x20 | uVar17 >> 0x1b);
    uVar19 = uVar19 * 0x40000000 | uVar19 >> 2;
    uVar23 = uVar26 ^ uVar18 ^ uVar30 ^ uVar24;
    uVar23 = uVar23 << 1 | (uint)((int)uVar23 < 0);
    uVar25 = uVar25 + uVar23 + (uVar19 ^ uVar20 ^ uVar17) + -0x359d3e2a +
             (uVar9 * 0x20 | uVar9 >> 0x1b);
    uVar21 = uVar17 * 0x40000000 | uVar17 >> 2;
    uVar17 = uVar29 ^ uVar12 ^ uVar10 ^ uVar22;
    uVar17 = uVar17 << 1 | (uint)((int)uVar17 < 0);
    uVar20 = uVar20 + uVar17 + (uVar21 ^ uVar19 ^ uVar9) + -0x359d3e2a +
             (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar9 = uVar9 * 0x40000000 | uVar9 >> 2;
    uVar6 = uVar18 ^ uVar28 ^ uVar16 ^ uVar6;
    uVar6 = uVar6 << 1 | (uint)((int)uVar6 < 0);
    uVar18 = uVar19 + uVar6 + (uVar9 ^ uVar21 ^ uVar25) + -0x359d3e2a +
             (uVar20 * 0x20 | uVar20 >> 0x1b);
    uVar23 = uVar12 ^ uVar14 ^ uVar8 ^ uVar23;
    uVar8 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar12 = uVar23 << 1 | (uint)((int)uVar23 < 0);
    uVar25 = uVar21 + uVar12 + (uVar8 ^ uVar9 ^ uVar20) + -0x359d3e2a +
             (uVar18 * 0x20 | uVar18 >> 0x1b);
    uVar17 = uVar28 ^ uVar13 ^ uVar7 ^ uVar17;
    uVar23 = uVar20 * 0x40000000 | uVar20 >> 2;
    uVar17 = (uVar17 << 1 | (uint)((int)uVar17 < 0)) + uVar9 + (uVar23 ^ uVar8 ^ uVar18) +
             -0x359d3e2a + (uVar25 * 0x20 | uVar25 >> 0x1b);
    uVar6 = uVar15 ^ uVar14 ^ uVar24 ^ uVar6;
    uVar7 = uVar18 * 0x40000000 | uVar18 >> 2;
    iVar11 = (uVar6 << 1 | (uint)((int)uVar6 < 0)) + uVar8 + (uVar7 ^ uVar23 ^ uVar25) +
             (uVar17 * 0x20 | uVar17 >> 0x1b);
    uVar12 = uVar30 ^ uVar13 ^ uVar22 ^ uVar12;
    uVar8 = uVar25 * 0x40000000 | uVar25 >> 2;
    uVar6 = iVar11 + 0xca62c1d6;
    ctx->hash[0] = (uVar12 << 1 | (uint)((int)uVar12 < 0)) + uVar1 + uVar23 +
                   (uVar8 ^ uVar7 ^ uVar17) + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
    ctx->hash[1] = uVar2 + iVar11 + 0xca62c1d6;
    ctx->hash[2] = (uVar17 * 0x40000000 | uVar17 >> 2) + uVar3;
    ctx->hash[3] = uVar8 + uVar4;
    ctx->hash[4] = uVar7 + pVar5;
  }
  return;
}

Assistant:

static void
pp_crypto_hash_sha1_process (PHashSHA1		*ctx,
			     const puint32	data[16])
{
	puint32	W[16];
	puint32	A;
	puint32	B;
	puint32	C;
	puint32	D;
	puint32	E;

	if (P_UNLIKELY (ctx == NULL))
		return;

	memcpy (W, data, 64);

	A = ctx->hash[0];
	B = ctx->hash[1];
	C = ctx->hash[2];
	D = ctx->hash[3];
	E = ctx->hash[4];

	P_SHA1_ROUND_0 (A, B, C, D, E, W[0])
	P_SHA1_ROUND_0 (E, A, B, C, D, W[1])
	P_SHA1_ROUND_0 (D, E, A, B, C, W[2])
	P_SHA1_ROUND_0 (C, D, E, A, B, W[3])
	P_SHA1_ROUND_0 (B, C, D, E, A, W[4])
	P_SHA1_ROUND_0 (A, B, C, D, E, W[5])
	P_SHA1_ROUND_0 (E, A, B, C, D, W[6])
	P_SHA1_ROUND_0 (D, E, A, B, C, W[7])
	P_SHA1_ROUND_0 (C, D, E, A, B, W[8])
	P_SHA1_ROUND_0 (B, C, D, E, A, W[9])
	P_SHA1_ROUND_0 (A, B, C, D, E, W[10])
	P_SHA1_ROUND_0 (E, A, B, C, D, W[11])
	P_SHA1_ROUND_0 (D, E, A, B, C, W[12])
	P_SHA1_ROUND_0 (C, D, E, A, B, W[13])
	P_SHA1_ROUND_0 (B, C, D, E, A, W[14])
	P_SHA1_ROUND_0 (A, B, C, D, E, W[15])
	P_SHA1_ROUND_0 (E, A, B, C, D, P_SHA1_W (W, 16))
	P_SHA1_ROUND_0 (D, E, A, B, C, P_SHA1_W (W, 17))
	P_SHA1_ROUND_0 (C, D, E, A, B, P_SHA1_W (W, 18))
	P_SHA1_ROUND_0 (B, C, D, E, A, P_SHA1_W (W, 19))

	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 20))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 21))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 22))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 23))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 24))
	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 25))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 26))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 27))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 28))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 29))
	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 30))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 31))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 32))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 33))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 34))
	P_SHA1_ROUND_1 (A, B, C, D, E, P_SHA1_W (W, 35))
	P_SHA1_ROUND_1 (E, A, B, C, D, P_SHA1_W (W, 36))
	P_SHA1_ROUND_1 (D, E, A, B, C, P_SHA1_W (W, 37))
	P_SHA1_ROUND_1 (C, D, E, A, B, P_SHA1_W (W, 38))
	P_SHA1_ROUND_1 (B, C, D, E, A, P_SHA1_W (W, 39))

	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 40))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 41))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 42))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 43))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 44))
	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 45))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 46))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 47))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 48))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 49))
	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 50))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 51))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 52))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 53))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 54))
	P_SHA1_ROUND_2 (A, B, C, D, E, P_SHA1_W (W, 55))
	P_SHA1_ROUND_2 (E, A, B, C, D, P_SHA1_W (W, 56))
	P_SHA1_ROUND_2 (D, E, A, B, C, P_SHA1_W (W, 57))
	P_SHA1_ROUND_2 (C, D, E, A, B, P_SHA1_W (W, 58))
	P_SHA1_ROUND_2 (B, C, D, E, A, P_SHA1_W (W, 59))

	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 60))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 61))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 62))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 63))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 64))
	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 65))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 66))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 67))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 68))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 69))
	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 70))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 71))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 72))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 73))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 74))
	P_SHA1_ROUND_3 (A, B, C, D, E, P_SHA1_W (W, 75))
	P_SHA1_ROUND_3 (E, A, B, C, D, P_SHA1_W (W, 76))
	P_SHA1_ROUND_3 (D, E, A, B, C, P_SHA1_W (W, 77))
	P_SHA1_ROUND_3 (C, D, E, A, B, P_SHA1_W (W, 78))
	P_SHA1_ROUND_3 (B, C, D, E, A, P_SHA1_W (W, 79))

	ctx->hash[0] += A;
	ctx->hash[1] += B;
	ctx->hash[2] += C;
	ctx->hash[3] += D;
	ctx->hash[4] += E;
}